

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

bool gch::operator==(small_vector<std::pair<std::pair<int,_int>,_double>,_8U,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                     *lhs,small_vector<std::pair<std::pair<int,_int>,_double>,_8U,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                          *rhs)

{
  size_ty sVar1;
  small_vector_iterator<const_std::pair<std::pair<int,_int>,_double>_*,_long> __first1;
  bool bVar2;
  
  sVar1 = (lhs->super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
          ).m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_size;
  if (sVar1 == (rhs->
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>)
               .m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               .m_size) {
    __first1.m_ptr =
         (lhs->super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>)
         .m_data.
         super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
         m_data_ptr;
    bVar2 = std::__equal<false>::
            equal<gch::small_vector_iterator<std::pair<std::pair<int,int>,double>const*,long>,gch::small_vector_iterator<std::pair<std::pair<int,int>,double>const*,long>>
                      (__first1,__first1.m_ptr + sVar1,
                       (rhs->
                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       ).m_data.
                       super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                       .m_data_ptr);
    return bVar2;
  }
  return false;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }